

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void pulse_prog_pillar_zap(OBJ_DATA *obj,bool isTick)

{
  ROOM_INDEX_DATA *pRVar1;
  CHAR_DATA *ch;
  bool bVar2;
  CHAR_DATA *pCVar3;
  char buf [4608];
  char acStack_1218 [4608];
  
  pRVar1 = obj->in_room;
  if (pRVar1 != (ROOM_INDEX_DATA *)0x0) {
    for (pCVar3 = pRVar1->people; pCVar3 != (CHAR_DATA *)0x0; pCVar3 = pCVar3->next_in_room) {
      bVar2 = is_npc(pCVar3);
      if ((bVar2) && (((pCVar3->act[0] & 0x4000) != 0 || ((pCVar3->form[0] & 0x100) != 0)))) {
        memcpy(acStack_1218,
               "\x1b[1;34mThe pillars crackle suddenly with raw energy and emit a beam of blinding light!\x1b[0m"
               ,0x5b);
        act(acStack_1218,pRVar1->people,(void *)0x0,(void *)0x0,4);
        pCVar3 = pRVar1->people;
        while (ch = pCVar3, ch != (CHAR_DATA *)0x0) {
          pCVar3 = ch->next_in_room;
          bVar2 = is_npc(ch);
          if ((bVar2) && (((ch->act[0] & 0x4000) != 0 || ((ch->form[0] & 0x100) != 0)))) {
            act("$n dissolves into dust as the shining blue light sweeps over it!",ch,(void *)0x0,
                (void *)0x0,0);
            extract_char(ch,true);
          }
        }
        return;
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_pillar_zap(OBJ_DATA *obj, bool isTick)
{
	char buf[MSL];
	CHAR_DATA *mob, *mob_next;
	ROOM_INDEX_DATA *room;
	bool found= false;

	if ((room = obj->in_room) == nullptr)
		return;

	if (!room->people)
		return;

	for (mob = room->people; mob; mob = mob->next_in_room)
	{
		if (is_npc(mob) && (IS_SET(mob->act, ACT_UNDEAD) || IS_SET(mob->form, FORM_UNDEAD)))
		{
			found = true;
			break;
		}
	}

	if (!found)
		return;

	sprintf(buf, "\x01B[1;34mThe pillars crackle suddenly with raw energy and emit a beam of blinding light!\x01B[0m");

	act(buf, room->people, 0, 0, TO_ALL);

	for (mob = room->people; mob; mob = mob_next)
	{
		mob_next = mob->next_in_room;

		if (is_npc(mob) && (IS_SET(mob->act, ACT_UNDEAD) || IS_SET(mob->form, FORM_UNDEAD)))
		{
			act("$n dissolves into dust as the shining blue light sweeps over it!", mob, 0, 0, TO_ROOM);
			extract_char(mob, true);
		}
	}
}